

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O3

string * __thiscall
vk::BinaryRegistryDetail::anon_unknown_8::getIndexPath
          (string *__return_storage_ptr__,anon_unknown_8 *this,string *dirName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *psVar3;
  allocator<char> local_79;
  FilePath local_78;
  FilePath local_58;
  FilePath local_38;
  
  paVar1 = &local_58.m_path.field_2;
  local_58.m_path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,this,this + (long)&dirName->_M_dataplus);
  paVar2 = &local_78.m_path.field_2;
  local_78.m_path._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"index.bin","");
  de::FilePath::join(&local_38,&local_58,&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_38.m_path._M_dataplus._M_p,&local_79);
  psVar3 = (string *)&local_38.m_path.field_2;
  if ((string *)local_38.m_path._M_dataplus._M_p != psVar3) {
    operator_delete(local_38.m_path._M_dataplus._M_p,
                    local_38.m_path.field_2._M_allocated_capacity + 1);
    psVar3 = extraout_RAX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.m_path._M_dataplus._M_p,
                    local_78.m_path.field_2._M_allocated_capacity + 1);
    psVar3 = extraout_RAX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_path._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.m_path._M_dataplus._M_p,
                    local_58.m_path.field_2._M_allocated_capacity + 1);
    psVar3 = extraout_RAX_01;
  }
  return psVar3;
}

Assistant:

string getIndexPath (const std::string& dirName)
{
	return de::FilePath::join(dirName, "index.bin").getPath();
}